

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

bool spvtools::opt::analysis::anon_unknown_4::IsSubset(DecorationSet *a,DecorationSet *b)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp;
  bool bVar3;
  
  p_Var1 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar3 = (_Rb_tree_header *)p_Var1 == &(a->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar3) {
      return bVar3;
    }
    if ((_Rb_tree_header *)p_Var2 == &(b->_M_t)._M_impl.super__Rb_tree_header) break;
    bVar3 = std::operator<((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)(p_Var1 + 1),
                           (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)(p_Var2 + 1));
    if (bVar3) {
      return false;
    }
    bVar3 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)(p_Var1 + 1),
                            (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)(p_Var2 + 1));
    if (bVar3) {
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return bVar3;
}

Assistant:

bool IsSubset(const DecorationSet& a, const DecorationSet& b) {
  auto it1 = a.begin();
  auto it2 = b.begin();

  while (it1 != a.end()) {
    if (it2 == b.end() || *it1 < *it2) {
      // |*it1| is in |a|, but not in |b|.
      return false;
    }
    if (*it1 == *it2) {
      // Found the element move to the next one.
      it1++;
      it2++;
    } else /* *it1 > *it2 */ {
      // Did not find |*it1| yet, check the next element in |b|.
      it2++;
    }
  }
  return true;
}